

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O2

uint32_t * gravity_bytecode_deserialize(char *buffer,size_t len,uint32_t *n)

{
  char cVar1;
  uint32_t uVar2;
  uint32_t *__ptr;
  long lVar3;
  uint32_t uVar4;
  int iVar5;
  uint32_t j;
  ulong uVar6;
  ulong uVar7;
  
  uVar7 = len >> 3 & 0x1fffffff;
  uVar2 = (uint32_t)uVar7;
  uVar6 = 0;
  __ptr = (uint32_t *)gravity_calloc((gravity_vm *)0x0,1,(ulong)(uVar2 * 4 + 4));
  do {
    if (uVar6 == uVar7) {
      *n = uVar2;
      return __ptr;
    }
    uVar4 = 0;
    for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
      cVar1 = buffer[lVar3];
      iVar5 = -0x37;
      if ((5 < (byte)(cVar1 + 0xbfU)) && (iVar5 = -0x30, 9 < (byte)(cVar1 - 0x30U))) {
        *n = 0;
        free(__ptr);
        return (uint32_t *)0x0;
      }
      uVar4 = uVar4 << 4 | iVar5 + cVar1;
    }
    __ptr[uVar6] = uVar4;
    uVar6 = uVar6 + 1;
    buffer = buffer + 8;
  } while( true );
}

Assistant:

uint32_t *gravity_bytecode_deserialize (const char *buffer, size_t len, uint32_t *n) {
    uint32_t ninst = (uint32_t)len / 8;
    uint32_t *bytecode = (uint32_t *)mem_alloc(NULL, sizeof(uint32_t) * (ninst + 1));    // +1 to get a 0 terminated bytecode (0 is opcode RET0)

    for (uint32_t j=0; j<ninst; ++j) {
        register uint32_t v = 0;

        for (uint32_t i=(j*8); i<=(j*8)+7; ++i) {
            // I was using a conversion code from
            // https://code.google.com/p/yara-project/source/browse/trunk/libyara/xtoi.c?r=150
            // but it caused issues under ARM processor so I decided to switch to an easier to read/maintain code
            // http://codereview.stackexchange.com/questions/42976/hexadecimal-to-integer-conversion-function

            // no needs to have also the case:
            // if (c >= 'a' && c <= 'f') {
            //        c = c - 'a' + 10;
            // }
            // because bytecode is always uppercase
            register uint32_t c = buffer[i];

            if (c >= 'A' && c <= 'F') {
                c = c - 'A' + 10;
            } else if (c >= '0' && c <= '9') {
                c -= '0';
            } else goto abort_conversion;

            v = v << 4 | c;

        }

        bytecode[j] = v;
    }

    *n = ninst;
    return bytecode;

abort_conversion:
    *n = 0;
    if (bytecode) mem_free(bytecode);
    return NULL;
}